

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandler *handler_00;
  int local_7d4c;
  int local_7d48;
  int ret;
  int written;
  int toconv;
  uchar *cur;
  uchar convbuf [32000];
  xmlCharEncodingHandler *handler;
  uint unused;
  xmlParserInputPtr in;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
  }
  else {
    pxVar1 = ctxt->input;
    if (pxVar1 == (xmlParserInputPtr)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
    }
    else if ((pxVar1->buf == (xmlParserInputBufferPtr)0x0) ||
            (pxVar1->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
      ctxt_local = (xmlParserCtxtPtr)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
    }
    else {
      handler._4_4_ = 0;
      handler_00 = pxVar1->buf->encoder;
      if (0 < (long)pxVar1->end - (long)pxVar1->cur) {
        _written = pxVar1->cur;
        do {
          ret = (int)pxVar1->end - (int)_written;
          local_7d48 = 32000;
          local_7d4c = xmlEncOutputChunk(handler_00,(uchar *)&cur,&local_7d48,_written,&ret);
          if (local_7d4c < 0) {
            if (local_7d48 < 1) {
              return -1;
            }
            local_7d4c = -2;
          }
          handler._4_4_ = local_7d48 + handler._4_4_;
          _written = _written + ret;
        } while (local_7d4c == -2);
      }
      if (pxVar1->buf->rawconsumed < (ulong)handler._4_4_) {
        ctxt_local = (xmlParserCtxtPtr)0xffffffffffffffff;
      }
      else {
        ctxt_local = (xmlParserCtxtPtr)(pxVar1->buf->rawconsumed - (ulong)handler._4_4_);
      }
    }
  }
  return (long)ctxt_local;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL) return(-1);
    in = ctxt->input;
    if (in == NULL)  return(-1);
    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        unsigned int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;
        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char convbuf[32000];
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv = in->end - in->cur, written = 32000;

	    int ret;

            do {
                toconv = in->end - cur;
                written = 32000;
                ret = xmlEncOutputChunk(handler, &convbuf[0], &written,
                                        cur, &toconv);
                if (ret < 0) {
                    if (written > 0)
                        ret = -2;
                    else
                        return(-1);
                }
                unused += written;
                cur += toconv;
            } while (ret == -2);
	}
	if (in->buf->rawconsumed < unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }
    return(in->consumed + (in->cur - in->base));
}